

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O1

ptr<asio_service> __thiscall
nuraft::nuraft_global_mgr::init_asio_service
          (nuraft_global_mgr *this,asio_service_options *asio_opt,ptr<logger> *logger_inst)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  asio_service *paVar1;
  int iVar2;
  pthread_mutex_t *__mutex;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  ptr<asio_service> pVar5;
  undefined1 local_39;
  asio_service *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  __mutex = (pthread_mutex_t *)get_instance();
  if (__mutex == (pthread_mutex_t *)0x0) {
    (this->asio_service_lock_).super___mutex_base._M_mutex.__align = 0;
    *(undefined8 *)((long)&(this->asio_service_lock_).super___mutex_base._M_mutex + 8) = 0;
    _Var4._M_pi = extraout_RDX;
  }
  else {
    iVar2 = pthread_mutex_lock(__mutex);
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    lVar3 = __mutex[1].__align;
    if (lVar3 == 0) {
      local_38 = (asio_service *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<nuraft::asio_service,std::allocator<nuraft::asio_service>,nuraft::asio_service_options_const&,std::shared_ptr<nuraft::logger>&>
                (a_Stack_30,&local_38,(allocator<nuraft::asio_service> *)&local_39,asio_opt,
                 logger_inst);
      _Var4._M_pi = a_Stack_30[0]._M_pi;
      paVar1 = local_38;
      local_38 = (asio_service *)0x0;
      a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)__mutex + 0x30);
      __mutex[1].__align = (long)paVar1;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)__mutex + 0x30) = _Var4._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
      }
      lVar3 = __mutex[1].__align;
    }
    (this->asio_service_lock_).super___mutex_base._M_mutex.__align = lVar3;
    lVar3 = *(long *)((long)__mutex + 0x30);
    *(long *)((long)&(this->asio_service_lock_).super___mutex_base._M_mutex + 8) = lVar3;
    if (lVar3 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
      }
    }
    pthread_mutex_unlock(__mutex);
    _Var4._M_pi = extraout_RDX_00;
  }
  pVar5.super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  pVar5.super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<asio_service>)
         pVar5.super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<asio_service> nuraft_global_mgr::init_asio_service
                  ( const asio_service_options& asio_opt,
                    ptr<logger> logger_inst )
{
    nuraft_global_mgr* mgr = get_instance();
    if (!mgr) return nullptr;

    std::lock_guard<std::mutex> l(mgr->asio_service_lock_);
    if (mgr->asio_service_) return mgr->asio_service_;

    mgr->asio_service_ = cs_new<asio_service>(asio_opt, logger_inst);
    return mgr->asio_service_;
}